

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image-write.h
# Opt level: O2

void stbiw__jpg_writeBits(stbi__write_context *s,int *bitBufP,int *bitCntP,unsigned_short *bs)

{
  int iVar1;
  uint uVar2;
  undefined1 local_42;
  undefined1 local_41;
  uint *local_40;
  int *local_38;
  
  iVar1 = (uint)bs[1] + *bitCntP;
  uVar2 = (uint)*bs << (0x18U - (char)iVar1 & 0x1f) | *bitBufP;
  local_40 = (uint *)bitBufP;
  local_38 = bitCntP;
  for (; 7 < iVar1; iVar1 = iVar1 + -8) {
    local_42 = (undefined1)(uVar2 >> 0x10);
    (*s->func)(s->context,&local_42,1);
    if ((~uVar2 & 0xff0000) == 0) {
      local_41 = 0;
      (*s->func)(s->context,&local_41,1);
    }
    uVar2 = uVar2 << 8;
  }
  *local_40 = uVar2;
  *local_38 = iVar1;
  return;
}

Assistant:

static void stbiw__jpg_writeBits(stbi__write_context *s, int *bitBufP, int *bitCntP, const unsigned short *bs) {
   int bitBuf = *bitBufP, bitCnt = *bitCntP;
   bitCnt += bs[1];
   bitBuf |= bs[0] << (24 - bitCnt);
   while(bitCnt >= 8) {
      unsigned char c = (bitBuf >> 16) & 255;
      stbiw__putc(s, c);
      if(c == 255) {
         stbiw__putc(s, 0);
      }
      bitBuf <<= 8;
      bitCnt -= 8;
   }
   *bitBufP = bitBuf;
   *bitCntP = bitCnt;
}